

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lines.cpp
# Opt level: O3

void just_test_test_case_f_test_split_lines(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pbVar5;
  pointer *ppbVar6;
  output_file *poVar7;
  char *s_;
  char *s__00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__01;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c_;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__00;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__01;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__02;
  basic_file_view<false> *c__03;
  char *s__02;
  char *s__03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__04;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__04;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__05;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__06;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__07;
  basic_file_view<false> *c__08;
  char (*s__05) [8];
  char (*s__06) [9];
  char (*s__07) [9];
  char (*s__08) [8];
  char (*s__09) [9];
  char (*s__10) [9];
  char (*s__11) [9];
  char (*s__12) [11];
  char (*s__13) [11];
  char (*s__14) [9];
  char (*s__15) [10];
  char (*s__16) [10];
  char (*s__17) [10];
  char (*s__18) [10];
  char (*s__19) [2];
  char (*s__20) [2];
  char *s__21;
  char *s__22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__23;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__09;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__10;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__11;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__12;
  basic_file_view<false> *c__13;
  size_type __dnew_20;
  size_type __dnew;
  string path;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v2;
  directory tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12;
  ifstream fs2;
  basic_file_view<false> view6;
  istringstream s1;
  istringstream s2;
  ifstream fs1;
  ifstream fs3;
  istringstream s3;
  pointer *local_f40;
  pointer local_f38;
  pointer local_f30 [2];
  assert_equal_container local_f20;
  pointer local_ef8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ef0;
  string local_ed8;
  _anonymous_namespace_ *local_eb8;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_eb0;
  _anonymous_namespace_ local_ea8;
  undefined1 uStack_ea7;
  undefined1 uStack_ea6;
  undefined1 uStack_ea5;
  undefined4 uStack_ea4;
  value_type local_e98;
  long *local_e78;
  long local_e70;
  long local_e68 [2];
  assert_equal_container local_e58;
  string_list_builder local_e30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_de8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_db8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_da0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d88;
  type local_d70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d58;
  undefined1 local_d40 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d20 [2];
  string_list_builder local_d00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ce8;
  undefined1 *local_cd0;
  void *local_cc8;
  undefined1 local_cc0;
  undefined1 uStack_cbf;
  undefined1 uStack_cbe;
  undefined1 uStack_cbd;
  undefined4 uStack_cbc;
  value_type local_ac8 [16];
  undefined1 local_8c0 [120];
  ios_base local_848 [264];
  string_list_builder local_740 [5];
  ios_base local_6c8 [264];
  output_file local_5c0 [13];
  value_type local_3b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0 [5];
  ios_base local_138 [264];
  
  local_e78 = local_e68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e78,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e58._assert_msg._filename._M_dataplus._M_p =
       (pointer)&local_e58._assert_msg._filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e58,local_e78,local_e70 + (long)local_e78);
  local_e58._assert_msg._line = 0x85;
  local_e98._M_dataplus._M_p = (pointer)&local_e98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e98,"");
  poVar7 = local_5c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d00._list,1,&local_e98,(allocator_type *)poVar7);
  just::temp::directory::directory((directory *)local_d20);
  local_ed8._M_dataplus._M_p = (pointer)&local_ed8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ed8,local_d20[0]._M_allocated_capacity,
             local_d20[0]._8_8_ + local_d20[0]._M_allocated_capacity);
  std::__cxx11::string::append((char *)&local_ed8);
  local_cd0 = &local_cc0;
  local_cc8 = (void *)0x0;
  local_cc0 = 0;
  just::file::impl::output_file::output_file(local_5c0,&local_ed8);
  just::file::impl::output_file::write(local_5c0,(int)local_cd0,local_cc8,(size_t)poVar7);
  just::file::impl::output_file::~output_file(local_5c0);
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  std::ifstream::ifstream(local_5c0,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&local_cd0,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(local_3b8,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  paVar2 = &local_ac8[0].field_2;
  local_ac8[0]._M_string_length = 0;
  local_ac8[0].field_2._M_local_buf[0] = '\0';
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_8c0,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ac8[0]._M_string_length = 0;
  local_ac8[0].field_2._M_local_buf[0] = '\0';
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_740,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ac8[0]._M_string_length = 0;
  local_ac8[0].field_2._M_local_buf[0] = '\0';
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_eb8 = &local_ea8;
  local_eb0 = (basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)0x0;
  local_ea8 = (_anonymous_namespace_)0x0;
  std::ifstream::ifstream(local_ac8,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  just::lines::split<false,char_const>(&local_e30._list,(lines *)0x1221de,s_);
  just::lines::split<false,char_const>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d40,(lines *)0x1221de,s__00);
  paVar1 = &local_f20._assert_msg._filename.field_2;
  local_f20._assert_msg._filename._M_string_length = 0;
  local_f20._assert_msg._filename.field_2._M_local_buf[0] = '\0';
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  just::lines::split<false,std::__cxx11::string>(&local_d70,(lines *)&local_f20,s__01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  just::lines::split<false>(&local_d88,(istream *)local_1b0);
  just::lines::split<false>(&local_da0,(istream *)local_3b8);
  just::lines::split_lines_of_file<false>(&local_db8,&local_ed8);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            (&local_dd0,local_eb8,local_eb0);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_de8,(_anonymous_namespace_ *)local_8c0,c_);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e00,(_anonymous_namespace_ *)local_5c0,c__00);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e18,(_anonymous_namespace_ *)local_740,c__01);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_d58,(_anonymous_namespace_ *)&local_cd0,c__02);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<false>>
            (&local_ce8,(_anonymous_namespace_ *)local_ac8,c__03);
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_e30._list,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d40,&local_d70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_d70,&local_d88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_d88,&local_da0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_da0,&local_db8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_db8,&local_dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_dd0,&local_de8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_de8,&local_e00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_e00,&local_e18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_e18,&local_d58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ce8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_de8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_db8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d40);
  std::ifstream::~ifstream(local_ac8);
  if (local_eb8 != &local_ea8) {
    operator_delete(local_eb8,
                    CONCAT44(uStack_ea4,
                             CONCAT13(uStack_ea5,CONCAT12(uStack_ea6,CONCAT11(uStack_ea7,local_ea8))
                                     )) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_740);
  std::ios_base::~ios_base(local_6c8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_8c0);
  std::ios_base::~ios_base(local_848);
  std::ifstream::~ifstream(local_3b8);
  std::ifstream::~ifstream(&local_cd0);
  std::ifstream::~ifstream(local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != &local_ed8.field_2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  just::temp::directory::~directory((directory *)local_d20);
  just::test::assert_equal_container::operator()(&local_e58,&local_d00,&local_e30._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e30._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d00._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e98._M_dataplus._M_p != &local_e98.field_2) {
    operator_delete(local_e98._M_dataplus._M_p,local_e98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e58._assert_msg._filename._M_dataplus._M_p !=
      &local_e58._assert_msg._filename.field_2) {
    operator_delete(local_e58._assert_msg._filename._M_dataplus._M_p,
                    local_e58._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e78 != local_e68) {
    operator_delete(local_e78,local_e68[0] + 1);
  }
  local_e78 = local_e68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e78,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e58._assert_msg._filename._M_dataplus._M_p =
       (pointer)&local_e58._assert_msg._filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e58,local_e78,local_e70 + (long)local_e78);
  local_e58._assert_msg._line = 0x86;
  local_e98._M_dataplus._M_p = (pointer)&local_e98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e98,"foo","");
  poVar7 = local_5c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d00._list,1,&local_e98,(allocator_type *)poVar7);
  just::temp::directory::directory((directory *)local_d20);
  local_ed8._M_dataplus._M_p = (pointer)&local_ed8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ed8,local_d20[0]._M_allocated_capacity,
             local_d20[0]._8_8_ + local_d20[0]._M_allocated_capacity);
  std::__cxx11::string::append((char *)&local_ed8);
  local_cd0 = &local_cc0;
  local_cc0 = 0x66;
  uStack_cbf = 0x6f;
  uStack_cbe = 0x6f;
  uStack_cbd = 0;
  local_cc8 = (void *)0x3;
  just::file::impl::output_file::output_file(local_5c0,&local_ed8);
  just::file::impl::output_file::write(local_5c0,(int)local_cd0,local_cc8,(size_t)poVar7);
  just::file::impl::output_file::~output_file(local_5c0);
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  std::ifstream::ifstream(local_5c0,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&local_cd0,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(local_3b8,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  local_ac8[0].field_2._M_local_buf[0] = 'f';
  local_ac8[0].field_2._M_local_buf[1] = 'o';
  local_ac8[0].field_2._M_local_buf[2] = 'o';
  local_ac8[0].field_2._M_local_buf[3] = '\0';
  local_ac8[0]._M_string_length = 3;
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_8c0,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ac8[0].field_2._M_local_buf[0] = 'f';
  local_ac8[0].field_2._M_local_buf[1] = 'o';
  local_ac8[0].field_2._M_local_buf[2] = 'o';
  local_ac8[0].field_2._M_local_buf[3] = '\0';
  local_ac8[0]._M_string_length = 3;
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_740,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ac8[0].field_2._M_local_buf[0] = 'f';
  local_ac8[0].field_2._M_local_buf[1] = 'o';
  local_ac8[0].field_2._M_local_buf[2] = 'o';
  local_ac8[0].field_2._M_local_buf[3] = '\0';
  local_ac8[0]._M_string_length = 3;
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_eb8 = &local_ea8;
  local_ea8 = (_anonymous_namespace_)0x66;
  uStack_ea7 = 0x6f;
  uStack_ea6 = 0x6f;
  uStack_ea5 = 0;
  local_eb0 = (basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)0x3;
  std::ifstream::ifstream(local_ac8,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  just::lines::split<false,char_const>(&local_e30._list,(lines *)"foo",s__02);
  just::lines::split<false,char_const>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d40,(lines *)"foo",s__03);
  local_f20._assert_msg._filename.field_2._M_local_buf[0] = 'f';
  local_f20._assert_msg._filename.field_2._M_local_buf[1] = 'o';
  local_f20._assert_msg._filename.field_2._M_local_buf[2] = 'o';
  local_f20._assert_msg._filename.field_2._M_local_buf[3] = '\0';
  local_f20._assert_msg._filename._M_string_length = 3;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  just::lines::split<false,std::__cxx11::string>(&local_d70,(lines *)&local_f20,s__04);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  just::lines::split<false>(&local_d88,(istream *)local_1b0);
  just::lines::split<false>(&local_da0,(istream *)local_3b8);
  just::lines::split_lines_of_file<false>(&local_db8,&local_ed8);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            (&local_dd0,local_eb8,local_eb0);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_de8,(_anonymous_namespace_ *)local_8c0,c__04);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e00,(_anonymous_namespace_ *)local_5c0,c__05);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e18,(_anonymous_namespace_ *)local_740,c__06);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_d58,(_anonymous_namespace_ *)&local_cd0,c__07);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<false>>
            (&local_ce8,(_anonymous_namespace_ *)local_ac8,c__08);
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_e30._list,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d40,&local_d70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_d70,&local_d88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_d88,&local_da0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_da0,&local_db8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_db8,&local_dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_dd0,&local_de8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_de8,&local_e00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_e00,&local_e18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef0);
  pbVar5 = local_ef0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f30[0] = local_ef0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_e18,&local_d58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ce8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_de8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_db8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d40);
  std::ifstream::~ifstream(local_ac8);
  if (local_eb8 != &local_ea8) {
    operator_delete(local_eb8,
                    CONCAT44(uStack_ea4,
                             CONCAT13(uStack_ea5,CONCAT12(uStack_ea6,CONCAT11(uStack_ea7,local_ea8))
                                     )) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_740);
  std::ios_base::~ios_base(local_6c8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_8c0);
  std::ios_base::~ios_base(local_848);
  std::ifstream::~ifstream(local_3b8);
  std::ifstream::~ifstream(&local_cd0);
  std::ifstream::~ifstream(local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != &local_ed8.field_2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  just::temp::directory::~directory((directory *)local_d20);
  just::test::assert_equal_container::operator()(&local_e58,&local_d00,&local_e30._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e30._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d00._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e98._M_dataplus._M_p != &local_e98.field_2) {
    operator_delete(local_e98._M_dataplus._M_p,local_e98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e58._assert_msg._filename._M_dataplus._M_p !=
      &local_e58._assert_msg._filename.field_2) {
    operator_delete(local_e58._assert_msg._filename._M_dataplus._M_p,
                    local_e58._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e78 != local_e68) {
    operator_delete(local_e78,local_e68[0] + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  paVar3 = &local_5c0[0]._filename.field_2;
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0x88;
  paVar4 = &local_3b8[0].field_2;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c0,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c0,local_ac8);
  (anonymous_namespace)::split_lines<false,8>
            (&local_740[0]._list,(_anonymous_namespace_ *)"foo\nbar",s__05);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,(string_list_builder *)local_8c0,
             &local_740[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0x89;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  pbVar5 = (pointer)(local_8c0 + 0x10);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\n\nbar",s__06)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0x8d;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\nbar\n",s__07)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0x92;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c0,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c0,local_ac8);
  (anonymous_namespace)::split_lines<false,8>
            (&local_740[0]._list,(_anonymous_namespace_ *)"foo\rbar",s__08);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,(string_list_builder *)local_8c0,
             &local_740[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0x96;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\r\rbar",s__09)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0x9a;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\rbar\r",s__10)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0x9f;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c0,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c0,local_ac8);
  (anonymous_namespace)::split_lines<false,9>
            (&local_740[0]._list,(_anonymous_namespace_ *)"foo\r\nbar",s__11);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,(string_list_builder *)local_8c0,
             &local_740[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xa3;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,11>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\n\r\nbar",s__12);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xa7;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,11>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\nbar\r\n",s__13);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xac;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\n\rbar",s__14)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xb0;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,10>
            (local_1b0,(_anonymous_namespace_ *)"foo\n\r\nbar",s__15);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xb4;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,10>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\r\nbar",s__16);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xb8;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,10>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\n\rbar",s__17);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xbc;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_740[0]._list,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,local_ac8);
  local_8c0._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_740[0]._list,(value_type *)local_8c0);
  (anonymous_namespace)::split_lines<false,10>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\n\nbar",s__18);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,local_740,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c0._0_8_ != pbVar5) {
    operator_delete((void *)local_8c0._0_8_,(ulong)(local_8c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xc1;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c0,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c0,local_ac8);
  (anonymous_namespace)::split_lines<false,2>
            (&local_740[0]._list,(_anonymous_namespace_ *)0x1221dd,s__19);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,(string_list_builder *)local_8c0,
             &local_740[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_cd0 = &local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_5c0[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_cd0,(undefined1 *)((long)local_cc8 + (long)local_cd0));
  local_5c0[0]._f._0_4_ = 0xc2;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c0,1,local_3b8,(allocator_type *)local_ac8);
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c0,local_ac8);
  (anonymous_namespace)::split_lines<false,2>
            (&local_740[0]._list,(_anonymous_namespace_ *)0x1221d7,s__20);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_5c0,(string_list_builder *)local_8c0,
             &local_740[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_740[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_5c0[0]._filename._M_dataplus._M_p,
                    local_5c0[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  local_e78 = local_e68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e78,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e58._assert_msg._filename._M_dataplus._M_p =
       (pointer)&local_e58._assert_msg._filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e58,local_e78,local_e70 + (long)local_e78);
  local_e58._assert_msg._line = 0xc3;
  local_e98._M_dataplus._M_p = (pointer)&local_e98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e98,"");
  poVar7 = local_5c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e30._list,1,&local_e98,(allocator_type *)poVar7);
  local_d40._0_8_ = (pointer)(local_d40 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d40,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e30._list,(value_type *)local_d40);
  just::temp::directory::directory((directory *)local_d20);
  local_ed8._M_dataplus._M_p = (pointer)&local_ed8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ed8,local_d20[0]._M_allocated_capacity,
             local_d20[0]._8_8_ + local_d20[0]._M_allocated_capacity);
  std::__cxx11::string::append((char *)&local_ed8);
  local_cd0 = &local_cc0;
  local_cc0 = 0xd;
  uStack_cbf = 10;
  local_cc8 = (void *)0x2;
  uStack_cbe = 0;
  just::file::impl::output_file::output_file(local_5c0,&local_ed8);
  just::file::impl::output_file::write(local_5c0,(int)local_cd0,local_cc8,(size_t)poVar7);
  just::file::impl::output_file::~output_file(local_5c0);
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,
                    CONCAT44(uStack_cbc,
                             CONCAT13(uStack_cbd,CONCAT12(uStack_cbe,CONCAT11(uStack_cbf,local_cc0))
                                     )) + 1);
  }
  std::ifstream::ifstream(local_5c0,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&local_cd0,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(local_3b8,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  local_ac8[0].field_2._M_local_buf[0] = '\r';
  local_ac8[0].field_2._M_local_buf[1] = '\n';
  local_ac8[0]._M_string_length = 2;
  local_ac8[0].field_2._M_local_buf[2] = '\0';
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_8c0,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ac8[0].field_2._M_local_buf[0] = '\r';
  local_ac8[0].field_2._M_local_buf[1] = '\n';
  local_ac8[0]._M_string_length = 2;
  local_ac8[0].field_2._M_local_buf[2] = '\0';
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_740,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ac8[0].field_2._M_local_buf[0] = '\r';
  local_ac8[0].field_2._M_local_buf[1] = '\n';
  local_ac8[0]._M_string_length = 2;
  local_ac8[0].field_2._M_local_buf[2] = '\0';
  local_ac8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_ac8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_ac8[0]._M_dataplus._M_p,
                    CONCAT44(local_ac8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ac8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_ac8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_ac8[0].field_2._M_local_buf[1],
                                                        local_ac8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_eb8 = &local_ea8;
  local_ea8 = (_anonymous_namespace_)0xd;
  uStack_ea7 = 10;
  local_eb0 = (basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)0x2;
  uStack_ea6 = 0;
  std::ifstream::ifstream(local_ac8,local_ed8._M_dataplus._M_p,_S_in|_S_bin);
  just::lines::split<false,char_const>(&local_ef0,(lines *)0x1221dc,s__21);
  just::lines::split<false,char_const>(&local_d70,(lines *)0x1221dc,s__22);
  local_f20._assert_msg._filename.field_2._M_local_buf[0] = '\r';
  local_f20._assert_msg._filename.field_2._M_local_buf[1] = '\n';
  local_f20._assert_msg._filename._M_string_length = 2;
  local_f20._assert_msg._filename.field_2._M_local_buf[2] = '\0';
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  just::lines::split<false,std::__cxx11::string>(&local_d88,(lines *)&local_f20,s__23);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  just::lines::split<false>(&local_da0,(istream *)local_1b0);
  just::lines::split<false>(&local_db8,(istream *)local_3b8);
  just::lines::split_lines_of_file<false>(&local_dd0,&local_ed8);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            (&local_de8,local_eb8,local_eb0);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e00,(_anonymous_namespace_ *)local_8c0,c__09);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e18,(_anonymous_namespace_ *)local_5c0,c__10);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_d58,(_anonymous_namespace_ *)local_740,c__11);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_ce8,(_anonymous_namespace_ *)&local_cd0,c__12);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<false>>
            (&local_d00._list,(_anonymous_namespace_ *)local_ac8,c__13);
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_ef0,&local_d70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_d70,&local_d88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_d88,&local_da0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_da0,&local_db8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_db8,&local_dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_dd0,&local_de8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_de8,&local_e00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_e00,&local_e18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_e18,&local_d58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  local_ef8 = (pointer)0x66;
  local_f40 = local_f30;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f40,(ulong)&local_ef8);
  pbVar5 = local_ef8;
  local_f30[0] = local_ef8;
  local_f40 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f38 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f20._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f20,local_f40,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f40);
  local_f20._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f20,&local_d58,&local_ce8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f20._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f20._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f20._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f20._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f20._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f40 != local_f30) {
    operator_delete(local_f40,(ulong)((long)&(local_f30[0]->_M_dataplus)._M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d00._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ce8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_de8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_db8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d70);
  std::ifstream::~ifstream(local_ac8);
  if (local_eb8 != &local_ea8) {
    operator_delete(local_eb8,
                    CONCAT44(uStack_ea4,
                             CONCAT13(uStack_ea5,CONCAT12(uStack_ea6,CONCAT11(uStack_ea7,local_ea8))
                                     )) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_740);
  std::ios_base::~ios_base(local_6c8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_8c0);
  std::ios_base::~ios_base(local_848);
  std::ifstream::~ifstream(local_3b8);
  std::ifstream::~ifstream(&local_cd0);
  std::ifstream::~ifstream(local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != &local_ed8.field_2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  just::temp::directory::~directory((directory *)local_d20);
  just::test::assert_equal_container::operator()(&local_e58,&local_e30,&local_ef0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ef0);
  if ((pointer)local_d40._0_8_ != (pointer)(local_d40 + 0x10)) {
    operator_delete((void *)local_d40._0_8_,(ulong)(local_d40._16_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e30._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e98._M_dataplus._M_p != &local_e98.field_2) {
    operator_delete(local_e98._M_dataplus._M_p,local_e98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e58._assert_msg._filename._M_dataplus._M_p !=
      &local_e58._assert_msg._filename.field_2) {
    operator_delete(local_e58._assert_msg._filename._M_dataplus._M_p,
                    local_e58._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e78 != local_e68) {
    operator_delete(local_e78,local_e68[0] + 1);
  }
  return;
}

Assistant:

JUST_TEST_CASE(test_split_lines_keeping_new_line)
{
  typedef string_list_builder v;

  JUST_ASSERT_EQUAL_CONTAINER(v(""), split_lines<true>(""));
  JUST_ASSERT_EQUAL_CONTAINER(v("foo"), split_lines<true>("foo"));

  JUST_ASSERT_EQUAL_CONTAINER(v("foo\n")("bar"), split_lines<true>("foo\nbar"));
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\n")("bar"),
    split_lines<true>("foo\n\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("bar\n")(""),
    split_lines<true>("foo\nbar\n")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("bar"),
    split_lines<true>("foo\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("\r")("bar"),
    split_lines<true>("foo\r\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("bar\r")(""),
    split_lines<true>("foo\rbar\r")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("bar"),
    split_lines<true>("foo\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\r\n")("bar"),
    split_lines<true>("foo\r\n\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("bar\r\n")(""),
    split_lines<true>("foo\r\nbar\r\n")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\r")("bar"),
    split_lines<true>("foo\n\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\r\n")("bar"),
    split_lines<true>("foo\n\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("\r\n")("bar"),
    split_lines<true>("foo\r\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\r")("bar"),
    split_lines<true>("foo\r\n\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\n")("bar"),
    split_lines<true>("foo\r\n\nbar")
  );

  JUST_ASSERT_EQUAL_CONTAINER(v("\n")(""), split_lines<true>("\n"));
  JUST_ASSERT_EQUAL_CONTAINER(v("\r")(""), split_lines<true>("\r"));
  JUST_ASSERT_EQUAL_CONTAINER(v("\r\n")(""), split_lines<true>("\r\n"));
}